

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamHttp_p.cpp
# Opt level: O3

bool __thiscall BamTools::Internal::BamHttp::ReceiveResponse(BamHttp *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long lVar3;
  HttpResponseHeader *this_00;
  bool bVar4;
  string headerLine;
  string responseHeader;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_90.field_2;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  do {
    bVar2 = TcpSocket::WaitForReadLine(this->m_socket);
    if (!bVar2) goto LAB_001b0026;
    TcpSocket::ReadLine_abi_cxx11_(&local_90,this->m_socket,0);
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_90._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    lVar3 = std::__cxx11::string::find((char *)&local_50,DOUBLE_NEWLINE_abi_cxx11_,0);
  } while (lVar3 != local_50._M_string_length - DAT_001edbb0);
  if (local_50._M_string_length == 0) {
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"BamHttp::ReceiveResponse","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"empty HTTP response","");
    IBamIODevice::SetErrorString(&this->super_IBamIODevice,&local_90,&local_70);
  }
  else {
    this_00 = (HttpResponseHeader *)operator_new(0x68);
    HttpResponseHeader::HttpResponseHeader(this_00,&local_50);
    this->m_response = this_00;
    bVar2 = HttpHeader::IsValid((HttpHeader *)this_00);
    bVar4 = true;
    if (bVar2) goto LAB_001b0028;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"BamHttp::ReceiveResponse","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"could not parse HTTP response","");
    IBamIODevice::SetErrorString(&this->super_IBamIODevice,&local_90,&local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  (*(this->super_IBamIODevice)._vptr_IBamIODevice[2])(this);
LAB_001b0026:
  bVar4 = false;
LAB_001b0028:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return bVar4;
}

Assistant:

bool BamHttp::ReceiveResponse()
{

    // fetch header, up until double new line
    std::string responseHeader;
    do {

        // make sure we can read a line
        if (!m_socket->WaitForReadLine()) return false;

        // read line & append to full header
        const std::string headerLine = m_socket->ReadLine();
        responseHeader += headerLine;

    } while (!endsWith(responseHeader, DOUBLE_NEWLINE));

    // sanity check
    if (responseHeader.empty()) {
        SetErrorString("BamHttp::ReceiveResponse", "empty HTTP response");
        Close();
        return false;
    }

    // create response from header text
    m_response = new HttpResponseHeader(responseHeader);
    if (!m_response->IsValid()) {
        SetErrorString("BamHttp::ReceiveResponse", "could not parse HTTP response");
        Close();
        return false;
    }

    // if we get here, success
    return true;
}